

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

int reduce_num_ref_buffers(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  SequenceHeader *seq_params;
  bool local_11;
  AV1_COMP *cpi_00;
  
  cpi_00 = *(AV1_COMP **)(in_RDI + 0x42008);
  iVar1 = is_one_pass_rt_params(cpi_00);
  local_11 = false;
  if (iVar1 != 0) {
    iVar1 = use_rtc_reference_structure_one_layer(cpi_00);
    local_11 = false;
    if ((iVar1 != 0) &&
       (local_11 = false, *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 4) == 0))
    {
      local_11 = *(int *)(in_RDI + 0x42d7c) != 0;
    }
  }
  return (int)local_11;
}

Assistant:

static inline int reduce_num_ref_buffers(const AV1_COMP *cpi) {
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  return is_one_pass_rt_params(cpi) &&
         use_rtc_reference_structure_one_layer(cpi) &&
         (seq_params->order_hint_info.enable_order_hint == 0) &&
         cpi->rt_reduce_num_ref_buffers;
}